

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  TestPartResult *in_RDX;
  string local_38;
  
  if ((result->type_ != kSuccess) && (result->type_ != kSkip)) {
    PrintTestPartResultToString_abi_cxx11_(&local_38,(internal *)result,in_RDX);
    puts(local_38._M_dataplus._M_p);
    fflush(_stdout);
    std::__cxx11::string::~string((string *)&local_38);
    fflush(_stdout);
  }
  return;
}

Assistant:

Type type() const { return type_; }